

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_read_inner(mg_connection *conn,void *buf,size_t len)

{
  long lVar1;
  char *__nptr;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  mg_connection *conn_00;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __n;
  uint uVar11;
  double dVar12;
  timespec tsnow;
  timespec local_58;
  void *local_48;
  long local_40;
  long local_38;
  
  lVar1 = conn->consumed_content;
  uVar4 = 0x7fffffffffffffff;
  if ((ulong)conn->content_len < 0x7fffffffffffffff) {
    uVar4 = conn->content_len;
  }
  sVar6 = uVar4 - lVar1;
  __n = 0;
  if (sVar6 != 0 && lVar1 <= (long)uVar4) {
    sVar9 = 0x7fffffff;
    if (len < 0x7fffffff) {
      sVar9 = len;
    }
    if ((long)sVar6 < (long)sVar9) {
      sVar9 = sVar6;
    }
    __n = (conn->data_len - lVar1) - (long)conn->request_len;
    if ((long)__n < 1) {
      __n = 0;
    }
    else {
      if ((long)sVar9 < (long)__n) {
        __n = sVar9;
      }
      memcpy(buf,conn->buf + lVar1 + conn->request_len,__n);
      sVar9 = sVar9 - __n;
      conn->consumed_content = conn->consumed_content + __n;
      buf = (void *)((long)buf + __n);
    }
    __nptr = conn->dom_ctx->config[0xb];
    if (__nptr == (char *)0x0) {
      dVar12 = -1.0;
    }
    else {
      iVar3 = atoi(__nptr);
      dVar12 = (double)iVar3 / 1000.0;
    }
    if (dVar12 <= 0.0) {
      dVar12 = strtod("30000",(char **)0x0);
      dVar12 = dVar12 / 1000.0;
    }
    clock_gettime(0,&local_58);
    uVar11 = 0;
    if (0 < (int)sVar9) {
      local_38 = local_58.tv_sec;
      uVar4 = (ulong)(dVar12 * 1000000000.0);
      local_40 = local_58.tv_nsec;
      uVar7 = (long)uVar4 >> 0x3f;
      uVar10 = (long)(dVar12 * 1000000000.0 - 9.223372036854776e+18) & uVar7;
      uVar11 = 0;
      bVar2 = true;
      local_48 = buf;
      do {
        conn_00 = (mg_connection *)((long)(int)uVar11 + (long)local_48);
        while( true ) {
          if (conn->phys_ctx->stop_flag != 0) goto LAB_0011411f;
          iVar8 = (int)sVar9;
          iVar3 = pull_inner((FILE *)conn,conn_00,(char *)(sVar9 & 0xffffffff),(int)uVar7,dVar12);
          if (iVar3 != -1) break;
          if (dVar12 < 0.0) goto LAB_0011411f;
          clock_gettime(0,&local_58);
          uVar7 = local_58.tv_nsec - local_40;
          if (!(bool)(bVar2 & (local_58.tv_sec - local_38) * 1000000000 + uVar7 <= (uVar10 | uVar4))
             ) goto LAB_0011411f;
        }
        if (iVar3 == 0) break;
        if (iVar3 == -2) {
          uVar11 = uVar11 | -(uint)(uVar11 == 0);
          break;
        }
        uVar11 = uVar11 + iVar3;
        uVar7 = (ulong)(uint)(iVar8 - iVar3);
        bVar2 = 0 < iVar8 - iVar3;
        sVar9 = (size_t)(uint)(iVar8 - iVar3);
      } while (iVar8 - iVar3 != 0 && iVar3 <= iVar8);
    }
LAB_0011411f:
    sVar5 = (size_t)(int)uVar11;
    if ((int)uVar11 < 0) {
      if ((long)__n < 1) {
        __n = sVar5;
      }
    }
    else {
      conn->consumed_content = conn->consumed_content + sVar5;
      __n = __n + sVar5;
    }
  }
  return (int)__n;
}

Assistant:

static int
mg_read_inner(struct mg_connection *conn, void *buf, size_t len)
{
	int64_t content_len, n, buffered_len, nread;
	int64_t len64 =
	    (int64_t)((len > INT_MAX) ? INT_MAX : len); /* since the return value is
	                                                 * int, we may not read more
	                                                 * bytes */
	const char *body;

	if (conn == NULL) {
		return 0;
	}

	/* If Content-Length is not set for a response with body data,
	 * we do not know in advance how much data should be read. */
	content_len = conn->content_len;
	if (content_len < 0) {
		/* The body data is completed when the connection is closed. */
		content_len = INT64_MAX;
	}

	nread = 0;
	if (conn->consumed_content < content_len) {
		/* Adjust number of bytes to read. */
		int64_t left_to_read = content_len - conn->consumed_content;
		if (left_to_read < len64) {
			/* Do not read more than the total content length of the
			 * request.
			 */
			len64 = left_to_read;
		}

		/* Return buffered data */
		buffered_len = (int64_t)(conn->data_len) - (int64_t)conn->request_len
		               - conn->consumed_content;
		if (buffered_len > 0) {
			if (len64 < buffered_len) {
				buffered_len = len64;
			}
			body = conn->buf + conn->request_len + conn->consumed_content;
			memcpy(buf, body, (size_t)buffered_len);
			len64 -= buffered_len;
			conn->consumed_content += buffered_len;
			nread += buffered_len;
			buf = (char *)buf + buffered_len;
		}

		/* We have returned all buffered data. Read new data from the remote
		 * socket.
		 */
		if ((n = pull_all(NULL, conn, (char *)buf, (int)len64)) >= 0) {
			conn->consumed_content += n;
			nread += n;
		} else {
			nread = ((nread > 0) ? nread : n);
		}
	}
	return (int)nread;
}